

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O1

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::RPCCall>
          (VerifierTemplate<false> *this,
          Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *vec)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((vec != (Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *)0x0) &&
     (bVar4 = *(int *)vec != 0, bVar4)) {
    bVar1 = reflection::RPCCall::Verify((RPCCall *)(vec + (ulong)*(uint *)(vec + 4) + 4),this);
    if (bVar1) {
      uVar3 = 0;
      uVar2 = 4;
      do {
        uVar3 = uVar3 + 1;
        bVar4 = uVar3 < *(uint *)vec;
        if (!bVar4) {
          return true;
        }
        bVar1 = reflection::RPCCall::Verify
                          ((RPCCall *)
                           (vec + (ulong)*(uint *)(vec + (ulong)uVar2 + 4) + (ulong)uVar2 + 4),this)
        ;
        uVar2 = uVar2 + 4;
      } while (bVar1);
    }
    if (bVar4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool VerifyVectorOfTables(const Vector<Offset<T>> *const vec) {
    if (vec) {
      for (uoffset_t i = 0; i < vec->size(); i++) {
        if (!vec->Get(i)->Verify(*this)) return false;
      }
    }
    return true;
  }